

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_report_topo_at(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_GEOM ref_geom;
  REF_ADJ pRVar2;
  REF_NODE ref_node;
  REF_CELL pRVar3;
  REF_ADJ_ITEM pRVar4;
  bool bVar5;
  uint uVar6;
  REF_INT *pRVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  REF_INT nodes [27];
  long local_b0;
  REF_INT local_a8 [30];
  
  if (-1 < node) {
    ref_geom = ref_grid->geom;
    pRVar2 = ref_geom->ref_adj;
    if ((node < pRVar2->nnode) && (local_b0 = (long)pRVar2->first[(uint)node], local_b0 != -1)) {
      ref_node = ref_grid->node;
      pRVar4 = pRVar2->item + local_b0;
      do {
        iVar1 = pRVar4->ref;
        pRVar7 = ref_geom->descr;
        if (pRVar7[(long)iVar1 * 6] == 1) {
          pRVar3 = ref_grid->cell[0];
          if (((-1 < node) && (pRVar2 = pRVar3->ref_adj, node < pRVar2->nnode)) &&
             (lVar9 = (long)pRVar2->first[(uint)node], lVar9 != -1)) {
            uVar6 = ref_cell_nodes(pRVar3,pRVar2->item[lVar9].ref,local_a8);
            if (uVar6 != 0) {
LAB_00144b93:
              uVar10 = (ulong)uVar6;
              pcVar11 = "edg nodes";
              uVar8 = 0x843;
              goto LAB_00144c7c;
            }
            bVar5 = false;
            while( true ) {
              pRVar7 = ref_geom->descr;
              if (pRVar7[(int)(iVar1 * 6 | 1)] == local_a8[pRVar3->node_per]) {
                bVar5 = true;
              }
              pRVar4 = pRVar3->ref_adj->item;
              lVar9 = (long)pRVar4[(int)lVar9].next;
              if (lVar9 == -1) break;
              uVar6 = ref_cell_nodes(pRVar3,pRVar4[lVar9].ref,local_a8);
              if (uVar6 != 0) goto LAB_00144b93;
            }
            if (bVar5) goto LAB_00144a88;
          }
          uVar6 = ref_node_location(ref_node,node);
          if (uVar6 != 0) {
            uVar10 = (ulong)uVar6;
            pcVar11 = "loc";
            uVar8 = 0x849;
            goto LAB_00144c7c;
          }
          ref_geom_tattle(ref_geom,node);
          uVar6 = ref_cell_tattle_about(pRVar3,node);
          if (uVar6 != 0) {
            uVar10 = (ulong)uVar6;
            pcVar11 = "cell tatt";
            uVar8 = 0x84b;
            goto LAB_00144c7c;
          }
          pRVar7 = ref_geom->descr;
        }
LAB_00144a88:
        if (pRVar7[(long)iVar1 * 6] == 2) {
          pRVar3 = ref_grid->cell[3];
          if (((-1 < node) && (pRVar2 = pRVar3->ref_adj, node < pRVar2->nnode)) &&
             (lVar9 = (long)pRVar2->first[(uint)node], lVar9 != -1)) {
            uVar6 = ref_cell_nodes(pRVar3,pRVar2->item[lVar9].ref,local_a8);
            if (uVar6 != 0) {
LAB_00144bbb:
              uVar10 = (ulong)uVar6;
              pcVar11 = "tri nodes";
              uVar8 = 0x852;
              goto LAB_00144c7c;
            }
            bVar5 = false;
            while( true ) {
              if (ref_geom->descr[(int)(iVar1 * 6 | 1)] == local_a8[pRVar3->node_per]) {
                bVar5 = true;
              }
              pRVar4 = pRVar3->ref_adj->item;
              lVar9 = (long)pRVar4[(int)lVar9].next;
              if (lVar9 == -1) break;
              uVar6 = ref_cell_nodes(pRVar3,pRVar4[lVar9].ref,local_a8);
              if (uVar6 != 0) goto LAB_00144bbb;
            }
            if (bVar5) goto LAB_00144b6a;
          }
          uVar6 = ref_node_location(ref_node,node);
          if (uVar6 != 0) {
            uVar10 = (ulong)uVar6;
            pcVar11 = "loc";
            uVar8 = 0x858;
LAB_00144c7c:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar8,"ref_geom_report_topo_at",uVar10,pcVar11);
            return (REF_STATUS)uVar10;
          }
          ref_geom_tattle(ref_geom,node);
          uVar6 = ref_cell_tattle_about(pRVar3,node);
          if (uVar6 != 0) {
            uVar10 = (ulong)uVar6;
            pcVar11 = "cell tatt";
            uVar8 = 0x85a;
            goto LAB_00144c7c;
          }
        }
LAB_00144b6a:
        pRVar4 = ref_geom->ref_adj->item;
        local_b0 = (long)pRVar4[(int)local_b0].next;
        if (local_b0 == -1) {
          return 0;
        }
        pRVar4 = pRVar4 + local_b0;
      } while( true );
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_report_topo_at(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT geom_item, geom;
  REF_INT cell_item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT have_match;

  each_ref_geom_having_node(ref_geom, node, geom_item, geom) {
    if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
      have_match = REF_FALSE;
      ref_cell = ref_grid_edg(ref_grid);
      each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "edg nodes");
        if (ref_geom_id(ref_geom, geom) == nodes[ref_cell_id_index(ref_cell)]) {
          have_match = REF_TRUE;
        }
      }
      if (!have_match) {
        RSS(ref_node_location(ref_node, node), "loc");
        RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
        RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
      }
    }
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      have_match = REF_FALSE;
      ref_cell = ref_grid_tri(ref_grid);
      each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "tri nodes");
        if (ref_geom_id(ref_geom, geom) == nodes[ref_cell_id_index(ref_cell)]) {
          have_match = REF_TRUE;
        }
      }
      if (!have_match) {
        RSS(ref_node_location(ref_node, node), "loc");
        RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
        RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
      }
    }
  }

  return REF_SUCCESS;
}